

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_client::timer_guard::timer_guard
          (timer_guard *this,coro_http_client *self,duration duration,string *msg)

{
  type local_49;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->self = self;
  (this->dur_).__r = duration.__r;
  ((self->socket_).
   super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  is_timeout_ = false;
  if (-1 < duration.__r) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 8),
               msg);
    timeout<coro_io::period_timer>
              ((coro_http_client *)local_48,(period_timer *)self,(duration)&self->timer_,
               (string *)duration.__r);
    async_simple::coro::detail::LazyBase<bool,_false>::
    start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_coro_http_client_hpp:633:20)>
              ((LazyBase<bool,_false> *)local_48,&local_49);
    async_simple::coro::detail::LazyBase<bool,_false>::~LazyBase((LazyBase<bool,_false> *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
  }
  return;
}

Assistant:

timer_guard(coro_http_client *self,
                std::chrono::steady_clock::duration duration, std::string msg)
        : self(self), dur_(duration) {
      self->socket_->is_timeout_ = false;

      if (duration.count() >= 0) {
        self->timeout(self->timer_, duration, std::move(msg))
            .start([](auto &&) {
            });
      }
      return;
    }